

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctred.c
# Opt level: O0

void jpeg_idct_2x2(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                  JSAMPARRAY output_buf,JDIMENSION output_col)

{
  undefined1 uVar1;
  int iVar2;
  long lVar3;
  undefined1 *puVar4;
  long in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  JCOEFPTR inptr;
  JLONG z1;
  JLONG tmp10;
  JLONG tmp0;
  int local_b8 [16];
  JSAMPLE dcval_1;
  int dcval;
  int workspace [16];
  int ctr;
  JSAMPLE *range_limit;
  JSAMPROW outptr;
  int *wsptr;
  ISLOW_MULT_TYPE *quantptr;
  
  workspace._8_8_ = *(long *)(in_RDI + 0x1a8) + 0x80;
  workspace._32_8_ = *(undefined8 *)(in_RSI + 0x58);
  workspace._24_8_ = local_b8;
  workspace._40_8_ = in_RDX;
  for (workspace[1] = 8; 0 < workspace[1]; workspace[1] = workspace[1] + -1) {
    if (((workspace[1] != 6) && (workspace[1] != 4)) && (workspace[1] != 2)) {
      if (((*(short *)(workspace._40_8_ + 0x10) == 0) && (*(short *)(workspace._40_8_ + 0x30) == 0))
         && ((*(short *)(workspace._40_8_ + 0x50) == 0 && (*(short *)(workspace._40_8_ + 0x70) == 0)
             ))) {
        iVar2 = (int)*(short *)workspace._40_8_ * (int)*(short *)workspace._32_8_ * 4;
        *(int *)workspace._24_8_ = iVar2;
        *(int *)(workspace._24_8_ + 0x20) = iVar2;
      }
      else {
        workspace._56_8_ =
             (long)((int)*(short *)workspace._40_8_ * (int)*(short *)workspace._32_8_) * 0x8000;
        lVar3 = (long)((int)*(short *)(workspace._40_8_ + 0x10) *
                      (int)*(short *)(workspace._32_8_ + 0x10)) * 0x73fc +
                (long)((int)*(short *)(workspace._40_8_ + 0x30) *
                      (int)*(short *)(workspace._32_8_ + 0x30)) * -0x28ba +
                (long)((int)*(short *)(workspace._40_8_ + 0x50) *
                      (int)*(short *)(workspace._32_8_ + 0x50)) * 0x1b37 +
                (long)((int)*(short *)(workspace._40_8_ + 0x70) *
                      (int)*(short *)(workspace._32_8_ + 0x70)) * -0x1712;
        *(int *)workspace._24_8_ = (int)(workspace._56_8_ + lVar3 + 0x1000 >> 0xd);
        *(int *)(workspace._24_8_ + 0x20) = (int)((workspace._56_8_ - lVar3) + 0x1000 >> 0xd);
      }
    }
    workspace._40_8_ = workspace._40_8_ + 2;
    workspace._32_8_ = workspace._32_8_ + 2;
    workspace._24_8_ = workspace._24_8_ + 4;
  }
  workspace._24_8_ = local_b8;
  for (workspace[1] = 0; workspace[1] < 2; workspace[1] = workspace[1] + 1) {
    puVar4 = (undefined1 *)(*(long *)(in_RCX + (long)workspace[1] * 8) + (ulong)in_R8D);
    if (((*(int *)(workspace._24_8_ + 4) == 0) && (*(int *)(workspace._24_8_ + 0xc) == 0)) &&
       ((*(int *)(workspace._24_8_ + 0x14) == 0 && (*(int *)(workspace._24_8_ + 0x1c) == 0)))) {
      uVar1 = *(undefined1 *)
               (workspace._8_8_ +
               (long)(int)((uint)((long)*(int *)workspace._24_8_ + 0x10 >> 5) & 0x3ff));
      *puVar4 = uVar1;
      puVar4[1] = uVar1;
    }
    else {
      iVar2 = *(int *)workspace._24_8_;
      lVar3 = (long)*(int *)(workspace._24_8_ + 0x1c) * -0x1712 +
              (long)*(int *)(workspace._24_8_ + 0x14) * 0x1b37 +
              (long)*(int *)(workspace._24_8_ + 0xc) * -0x28ba +
              (long)*(int *)(workspace._24_8_ + 4) * 0x73fc;
      *puVar4 = *(undefined1 *)
                 (workspace._8_8_ +
                 (long)(int)((uint)((long)iVar2 * 0x8000 + lVar3 + 0x80000 >> 0x14) & 0x3ff));
      puVar4[1] = *(undefined1 *)
                   (workspace._8_8_ +
                   (long)(int)((uint)(((long)iVar2 * 0x8000 - lVar3) + 0x80000 >> 0x14) & 0x3ff));
    }
    workspace._24_8_ = workspace._24_8_ + 0x20;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_2x2(j_decompress_ptr cinfo, jpeg_component_info *compptr,
              JCOEFPTR coef_block, JSAMPARRAY output_buf,
              JDIMENSION output_col)
{
  JLONG tmp0, tmp10, z1;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE *quantptr;
  int *wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[DCTSIZE * 2];   /* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *)compptr->dct_table;
  wsptr = workspace;
  for (ctr = DCTSIZE; ctr > 0; inptr++, quantptr++, wsptr++, ctr--) {
    /* Don't bother to process columns 2,4,6 */
    if (ctr == DCTSIZE - 2 || ctr == DCTSIZE - 4 || ctr == DCTSIZE - 6)
      continue;
    if (inptr[DCTSIZE * 1] == 0 && inptr[DCTSIZE * 3] == 0 &&
        inptr[DCTSIZE * 5] == 0 && inptr[DCTSIZE * 7] == 0) {
      /* AC terms all zero; we need not examine terms 2,4,6 for 2x2 output */
      int dcval = LEFT_SHIFT(DEQUANTIZE(inptr[DCTSIZE * 0],
                             quantptr[DCTSIZE * 0]), PASS1_BITS);

      wsptr[DCTSIZE * 0] = dcval;
      wsptr[DCTSIZE * 1] = dcval;

      continue;
    }

    /* Even part */

    z1 = DEQUANTIZE(inptr[DCTSIZE * 0], quantptr[DCTSIZE * 0]);
    tmp10 = LEFT_SHIFT(z1, CONST_BITS + 2);

    /* Odd part */

    z1 = DEQUANTIZE(inptr[DCTSIZE * 7], quantptr[DCTSIZE * 7]);
    tmp0 = MULTIPLY(z1, -FIX_0_720959822);  /* sqrt(2) * ( c7-c5+c3-c1) */
    z1 = DEQUANTIZE(inptr[DCTSIZE * 5], quantptr[DCTSIZE * 5]);
    tmp0 += MULTIPLY(z1, FIX_0_850430095);  /* sqrt(2) * (-c1+c3+c5+c7) */
    z1 = DEQUANTIZE(inptr[DCTSIZE * 3], quantptr[DCTSIZE * 3]);
    tmp0 += MULTIPLY(z1, -FIX_1_272758580); /* sqrt(2) * (-c1+c3-c5-c7) */
    z1 = DEQUANTIZE(inptr[DCTSIZE * 1], quantptr[DCTSIZE * 1]);
    tmp0 += MULTIPLY(z1, FIX_3_624509785);  /* sqrt(2) * ( c1+c3+c5+c7) */

    /* Final output stage */

    wsptr[DCTSIZE * 0] =
      (int)DESCALE(tmp10 + tmp0, CONST_BITS - PASS1_BITS + 2);
    wsptr[DCTSIZE * 1] =
      (int)DESCALE(tmp10 - tmp0, CONST_BITS - PASS1_BITS + 2);
  }

  /* Pass 2: process 2 rows from work array, store into output array. */

  wsptr = workspace;
  for (ctr = 0; ctr < 2; ctr++) {
    outptr = output_buf[ctr] + output_col;
    /* It's not clear whether a zero row test is worthwhile here ... */

#ifndef NO_ZERO_ROW_TEST
    if (wsptr[1] == 0 && wsptr[3] == 0 && wsptr[5] == 0 && wsptr[7] == 0) {
      /* AC terms all zero */
      JSAMPLE dcval = range_limit[(int)DESCALE((JLONG)wsptr[0],
                                               PASS1_BITS + 3) & RANGE_MASK];

      outptr[0] = dcval;
      outptr[1] = dcval;

      wsptr += DCTSIZE;         /* advance pointer to next row */
      continue;
    }
#endif

    /* Even part */

    tmp10 = LEFT_SHIFT((JLONG)wsptr[0], CONST_BITS + 2);

    /* Odd part */

    tmp0 = MULTIPLY((JLONG)wsptr[7], -FIX_0_720959822) + /* sqrt(2) * ( c7-c5+c3-c1) */
           MULTIPLY((JLONG)wsptr[5],  FIX_0_850430095) + /* sqrt(2) * (-c1+c3+c5+c7) */
           MULTIPLY((JLONG)wsptr[3], -FIX_1_272758580) + /* sqrt(2) * (-c1+c3-c5-c7) */
           MULTIPLY((JLONG)wsptr[1],  FIX_3_624509785);  /* sqrt(2) * ( c1+c3+c5+c7) */

    /* Final output stage */

    outptr[0] = range_limit[(int)DESCALE(tmp10 + tmp0,
                                         CONST_BITS + PASS1_BITS + 3 + 2) &
                            RANGE_MASK];
    outptr[1] = range_limit[(int)DESCALE(tmp10 - tmp0,
                                         CONST_BITS + PASS1_BITS + 3 + 2) &
                            RANGE_MASK];

    wsptr += DCTSIZE;           /* advance pointer to next row */
  }
}